

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O1

void png_set_quantize(png_structrp png_ptr,png_colorp palette,int num_palette,int maximum_colors,
                     png_const_uint_16p histogram,int full_quantize)

{
  png_bytep *pppVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  undefined8 *ptr;
  png_byte pVar5;
  png_byte pVar6;
  png_byte pVar7;
  png_bytep ppVar8;
  undefined8 *puVar9;
  png_voidp pvVar10;
  uint uVar11;
  long *plVar12;
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  png_colorp ppVar21;
  png_colorp ppVar22;
  png_byte pVar23;
  uint uVar24;
  uint uVar25;
  byte *pbVar26;
  ulong uVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  png_byte *ppVar37;
  bool bVar38;
  png_color tmp_color;
  long local_60;
  png_byte *local_50;
  
  if (png_ptr != (png_structrp)0x0) {
    if ((png_ptr->flags & 0x40) != 0) {
      png_app_error(png_ptr,"invalid after png_start_read_image or png_read_update_info");
      return;
    }
    uVar13 = (ulong)(uint)num_palette;
    png_ptr->flags = png_ptr->flags | 0x4000;
    *(byte *)&png_ptr->transformations = (byte)png_ptr->transformations | 0x40;
    if (full_quantize == 0) {
      ppVar8 = (png_bytep)png_malloc(png_ptr,(long)num_palette);
      png_ptr->quantize_index = ppVar8;
      if (0 < num_palette) {
        uVar17 = 0;
        do {
          png_ptr->quantize_index[uVar17] = (png_byte)uVar17;
          uVar17 = uVar17 + 1;
        } while ((uint)num_palette != uVar17);
      }
    }
    if (maximum_colors < num_palette) {
      ppVar8 = (png_bytep)png_malloc(png_ptr,(long)num_palette);
      if (histogram == (png_const_uint_16p)0x0) {
        png_ptr->index_to_palette = ppVar8;
        ppVar8 = (png_bytep)png_malloc(png_ptr,(long)num_palette);
        png_ptr->palette_to_index = ppVar8;
        if (0 < num_palette) {
          uVar17 = 0;
          do {
            png_ptr->index_to_palette[uVar17] = (png_byte)uVar17;
            png_ptr->palette_to_index[uVar17] = (png_byte)uVar17;
            uVar17 = uVar17 + 1;
          } while (uVar13 != uVar17);
        }
        pppVar1 = &png_ptr->index_to_palette;
        pvVar10 = png_calloc(png_ptr,0x1808);
        if (maximum_colors < num_palette) {
          uVar11 = 0x60;
          local_60 = 0x61;
          puVar9 = (undefined8 *)0x0;
          do {
            iVar31 = (int)uVar13;
            iVar29 = 1;
            if (1 < iVar31) {
              iVar29 = iVar31;
            }
            iVar34 = 2;
            uVar17 = 0;
            local_50 = &palette[1].blue;
            do {
              if (uVar17 == iVar29 - 1) break;
              ppVar21 = palette + uVar17;
              ppVar37 = local_50;
              iVar35 = iVar34;
              do {
                uVar15 = (uint)ppVar21->red - (uint)((png_color *)(ppVar37 + -2))->red;
                uVar20 = -uVar15;
                if (0 < (int)uVar15) {
                  uVar20 = uVar15;
                }
                uVar24 = (uint)ppVar21->green - (uint)ppVar37[-1];
                uVar15 = -uVar24;
                if (0 < (int)uVar24) {
                  uVar15 = uVar24;
                }
                uVar25 = (uint)ppVar21->blue - (uint)*ppVar37;
                uVar24 = -uVar25;
                if (0 < (int)uVar25) {
                  uVar24 = uVar25;
                }
                uVar20 = (uVar24 & 0xff) + (uVar15 & 0xff) + (uVar20 & 0xff);
                bVar38 = true;
                if (uVar20 <= uVar11) {
                  puVar9 = (undefined8 *)png_malloc_warn(png_ptr,0x10);
                  bVar38 = puVar9 == (undefined8 *)0x0;
                  if (bVar38) {
                    puVar9 = (undefined8 *)0x0;
                  }
                  else {
                    *puVar9 = *(undefined8 *)((long)pvVar10 + (ulong)uVar20 * 8);
                    *(char *)(puVar9 + 1) = (char)uVar17;
                    *(char *)((long)puVar9 + 9) = (char)iVar35 + -1;
                    *(undefined8 **)((long)pvVar10 + (ulong)uVar20 * 8) = puVar9;
                  }
                  bVar38 = !bVar38;
                }
                if (!bVar38) break;
                ppVar37 = ppVar37 + 3;
                bVar38 = iVar35 < iVar31;
                iVar35 = iVar35 + 1;
              } while (bVar38);
              iVar34 = iVar34 + 1;
              local_50 = local_50 + 3;
              uVar17 = uVar17 + 1;
            } while (puVar9 != (undefined8 *)0x0);
            if (puVar9 != (undefined8 *)0x0) {
              lVar33 = 0;
              do {
                plVar12 = *(long **)((long)pvVar10 + lVar33 * 8);
                if (plVar12 != (long *)0x0) {
                  do {
                    ppVar8 = *pppVar1;
                    bVar2 = *(byte *)(plVar12 + 1);
                    iVar29 = (int)uVar13;
                    if (((int)(uint)ppVar8[bVar2] < iVar29) &&
                       (bVar3 = *(byte *)((long)plVar12 + 9), (int)(uint)ppVar8[bVar3] < iVar29)) {
                      bVar14 = bVar2;
                      if ((uVar13 & 1) == 0) {
                        bVar14 = bVar3;
                      }
                      uVar20 = iVar29 - 1;
                      uVar17 = (ulong)uVar20;
                      bVar4 = ppVar8[bVar14];
                      palette[bVar4].blue = palette[uVar17].blue;
                      pVar23 = palette[uVar17].green;
                      palette[bVar4].red = palette[uVar17].red;
                      palette[bVar4].green = pVar23;
                      if (0 < num_palette && full_quantize == 0) {
                        if ((uVar13 & 1) == 0) {
                          bVar3 = bVar2;
                        }
                        uVar13 = 0;
                        do {
                          if (png_ptr->quantize_index[uVar13] == png_ptr->index_to_palette[bVar14])
                          {
                            png_ptr->quantize_index[uVar13] = png_ptr->index_to_palette[bVar3];
                          }
                          if (uVar20 == png_ptr->quantize_index[uVar13]) {
                            png_ptr->quantize_index[uVar13] = (*pppVar1)[bVar14];
                          }
                          uVar13 = uVar13 + 1;
                        } while ((uint)num_palette != uVar13);
                      }
                      png_ptr->index_to_palette[png_ptr->palette_to_index[uVar17]] =
                           png_ptr->index_to_palette[bVar14];
                      png_ptr->palette_to_index[png_ptr->index_to_palette[bVar14]] =
                           png_ptr->palette_to_index[uVar17];
                      png_ptr->index_to_palette[bVar14] = (png_byte)uVar20;
                      png_ptr->palette_to_index[uVar17] = bVar14;
                      uVar13 = uVar17;
                    }
                  } while ((maximum_colors < (int)uVar13) &&
                          (plVar12 = (long *)*plVar12, plVar12 != (long *)0x0));
                  if ((int)uVar13 <= maximum_colors) break;
                }
                lVar33 = lVar33 + 1;
              } while (lVar33 != local_60);
            }
            lVar33 = 0;
            do {
              ptr = *(undefined8 **)((long)pvVar10 + lVar33 * 8);
              while (ptr != (undefined8 *)0x0) {
                puVar9 = (undefined8 *)*ptr;
                png_free(png_ptr,ptr);
                ptr = puVar9;
              }
              *(undefined8 *)((long)pvVar10 + lVar33 * 8) = 0;
              lVar33 = lVar33 + 1;
            } while (lVar33 != 0x301);
            uVar11 = uVar11 + 0x60;
            local_60 = local_60 + 0x60;
          } while (maximum_colors < (int)uVar13);
        }
        png_free(png_ptr,pvVar10);
        png_free(png_ptr,png_ptr->palette_to_index);
        png_free(png_ptr,png_ptr->index_to_palette);
        *pppVar1 = (png_bytep)0x0;
        png_ptr->palette_to_index = (png_bytep)0x0;
        num_palette = maximum_colors;
      }
      else {
        png_ptr->quantize_sort = ppVar8;
        if (0 < num_palette) {
          uVar17 = 0;
          do {
            png_ptr->quantize_sort[uVar17] = (png_byte)uVar17;
            uVar17 = uVar17 + 1;
          } while ((uint)num_palette != uVar17);
        }
        iVar29 = 1;
        if (1 < maximum_colors) {
          iVar29 = maximum_colors;
        }
        uVar11 = num_palette - 1;
        uVar17 = uVar13;
        do {
          if ((int)uVar17 <= iVar29) break;
          uVar17 = (ulong)((int)uVar17 - 1);
          bVar38 = true;
          uVar18 = 0;
          do {
            ppVar8 = png_ptr->quantize_sort;
            bVar2 = ppVar8[uVar18];
            if (histogram[bVar2] < histogram[ppVar8[uVar18 + 1]]) {
              ppVar8[uVar18] = ppVar8[uVar18 + 1];
              png_ptr->quantize_sort[uVar18 + 1] = bVar2;
              bVar38 = false;
            }
            uVar18 = uVar18 + 1;
          } while (uVar11 != uVar18);
          uVar11 = uVar11 - 1;
        } while (!bVar38);
        if (full_quantize == 0) {
          if (0 < maximum_colors) {
            uVar13 = 0;
            iVar29 = num_palette;
            do {
              if (maximum_colors <= (int)(uint)png_ptr->quantize_sort[uVar13]) {
                lVar33 = (long)iVar29;
                ppVar21 = palette + iVar29;
                do {
                  ppVar22 = ppVar21;
                  lVar19 = lVar33 + -1;
                  iVar29 = iVar29 + -1;
                  ppVar21 = ppVar22 + -1;
                  lVar32 = lVar33 + -1;
                  lVar33 = lVar19;
                } while ((byte)maximum_colors <= png_ptr->quantize_sort[lVar32]);
                pVar23 = ppVar22[-1].blue;
                pVar6 = ppVar21->red;
                pVar7 = ppVar21->green;
                ppVar22[-1].blue = palette[uVar13].blue;
                pVar5 = palette[uVar13].green;
                ppVar21->red = palette[uVar13].red;
                ppVar21->green = pVar5;
                palette[uVar13].red = pVar6;
                palette[uVar13].green = pVar7;
                palette[uVar13].blue = pVar23;
                png_ptr->quantize_index[lVar19] = (png_byte)uVar13;
                png_ptr->quantize_index[uVar13] = (png_byte)iVar29;
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != (uint)maximum_colors);
          }
          if (0 < num_palette) {
            uVar13 = 0;
            do {
              bVar2 = png_ptr->quantize_index[uVar13];
              if (maximum_colors <= (int)(uint)bVar2) {
                uVar17 = 0;
                pVar23 = '\0';
                if (1 < maximum_colors) {
                  iVar31 = (uint)palette[bVar2].green - (uint)palette->green;
                  iVar29 = -iVar31;
                  if (0 < iVar31) {
                    iVar29 = iVar31;
                  }
                  iVar34 = (uint)palette[bVar2].red - (uint)palette->red;
                  iVar31 = -iVar34;
                  if (0 < iVar34) {
                    iVar31 = iVar34;
                  }
                  iVar35 = (uint)palette[bVar2].blue - (uint)palette->blue;
                  iVar34 = -iVar35;
                  if (0 < iVar35) {
                    iVar34 = iVar35;
                  }
                  iVar34 = iVar34 + iVar31 + iVar29;
                  uVar18 = 1;
                  ppVar37 = &palette[1].blue;
                  do {
                    iVar31 = (uint)palette[bVar2].red - (uint)((png_color *)(ppVar37 + -2))->red;
                    iVar29 = -iVar31;
                    if (0 < iVar31) {
                      iVar29 = iVar31;
                    }
                    iVar35 = (uint)palette[bVar2].green - (uint)ppVar37[-1];
                    iVar31 = -iVar35;
                    if (0 < iVar35) {
                      iVar31 = iVar35;
                    }
                    iVar30 = (uint)palette[bVar2].blue - (uint)*ppVar37;
                    iVar35 = -iVar30;
                    if (0 < iVar30) {
                      iVar35 = iVar30;
                    }
                    iVar35 = iVar35 + iVar31 + iVar29;
                    if (iVar35 < iVar34) {
                      uVar17 = uVar18 & 0xffffffff;
                      iVar34 = iVar35;
                    }
                    pVar23 = (png_byte)uVar17;
                    uVar18 = uVar18 + 1;
                    ppVar37 = ppVar37 + 3;
                  } while ((uint)maximum_colors != uVar18);
                }
                png_ptr->quantize_index[uVar13] = pVar23;
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != (uint)num_palette);
          }
        }
        else if (0 < maximum_colors) {
          ppVar8 = png_ptr->quantize_sort;
          uVar17 = 0;
          do {
            if (maximum_colors <= (int)(uint)ppVar8[uVar17]) {
              ppVar21 = palette + (int)uVar13;
              pbVar26 = ppVar8 + (long)(int)uVar13 + -1;
              do {
                ppVar22 = ppVar21;
                ppVar21 = ppVar22 + -1;
                uVar13 = (ulong)((int)uVar13 - 1);
                bVar2 = *pbVar26;
                pbVar26 = pbVar26 + -1;
              } while ((byte)maximum_colors <= bVar2);
              palette[uVar17].blue = ppVar22[-1].blue;
              pVar23 = ppVar21->green;
              palette[uVar17].red = ppVar21->red;
              palette[uVar17].green = pVar23;
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != (uint)maximum_colors);
        }
        png_free(png_ptr,png_ptr->quantize_sort);
        png_ptr->quantize_sort = (png_bytep)0x0;
        num_palette = maximum_colors;
      }
    }
    if (png_ptr->palette == (png_colorp)0x0) {
      png_ptr->palette = palette;
    }
    png_ptr->num_palette = (png_uint_16)num_palette;
    if (full_quantize != 0) {
      ppVar8 = (png_bytep)png_calloc(png_ptr,0x8000);
      png_ptr->palette_lookup = ppVar8;
      pvVar10 = png_malloc(png_ptr,0x8000);
      memset(pvVar10,0xff,0x8000);
      if (0 < num_palette) {
        uVar13 = 0;
        do {
          bVar2 = palette[uVar13].red >> 3;
          uVar11 = (uint)(palette[uVar13].green >> 3);
          uVar20 = (uint)(palette[uVar13].blue >> 3);
          lVar33 = 0;
          uVar17 = 0;
          do {
            uVar15 = (int)uVar17 - (uint)bVar2;
            if (uVar17 <= bVar2) {
              uVar15 = (uint)bVar2 - (int)uVar17;
            }
            uVar18 = 0;
            lVar32 = lVar33;
            do {
              uVar24 = (int)uVar18 - uVar11;
              if (uVar18 <= uVar11) {
                uVar24 = uVar11 - (int)uVar18;
              }
              uVar25 = uVar24;
              if ((int)uVar24 < (int)uVar15) {
                uVar25 = uVar15;
              }
              uVar27 = 0;
              uVar16 = uVar20;
              do {
                uVar28 = (int)uVar27 - uVar20;
                if (uVar27 <= uVar20) {
                  uVar28 = uVar16;
                }
                uVar36 = uVar28;
                if ((int)uVar28 < (int)uVar25) {
                  uVar36 = uVar25;
                }
                iVar29 = uVar28 + uVar15 + uVar24 + uVar36;
                if (iVar29 < (int)(uint)*(byte *)((long)pvVar10 + uVar27 + lVar32)) {
                  *(char *)((long)pvVar10 + uVar27 + lVar32) = (char)iVar29;
                  png_ptr->palette_lookup[uVar27 + lVar32] = (png_byte)uVar13;
                }
                uVar27 = uVar27 + 1;
                uVar16 = uVar16 - 1;
              } while (uVar27 != 0x20);
              uVar18 = uVar18 + 1;
              lVar32 = lVar32 + 0x20;
            } while (uVar18 != 0x20);
            uVar17 = uVar17 + 1;
            lVar33 = lVar33 + 0x400;
          } while (uVar17 != 0x20);
          uVar13 = uVar13 + 1;
        } while (uVar13 != (uint)num_palette);
      }
      png_free(png_ptr,pvVar10);
      return;
    }
  }
  return;
}

Assistant:

void PNGAPI
png_set_quantize(png_structrp png_ptr, png_colorp palette,
    int num_palette, int maximum_colors, png_const_uint_16p histogram,
    int full_quantize)
{
   png_debug(1, "in png_set_quantize");

   if (png_rtran_ok(png_ptr, 0) == 0)
      return;

   png_ptr->transformations |= PNG_QUANTIZE;

   if (full_quantize == 0)
   {
      int i;

      png_ptr->quantize_index = (png_bytep)png_malloc(png_ptr,
          (png_alloc_size_t)num_palette);
      for (i = 0; i < num_palette; i++)
         png_ptr->quantize_index[i] = (png_byte)i;
   }

   if (num_palette > maximum_colors)
   {
      if (histogram != NULL)
      {
         /* This is easy enough, just throw out the least used colors.
          * Perhaps not the best solution, but good enough.
          */

         int i;

         /* Initialize an array to sort colors */
         png_ptr->quantize_sort = (png_bytep)png_malloc(png_ptr,
             (png_alloc_size_t)num_palette);

         /* Initialize the quantize_sort array */
         for (i = 0; i < num_palette; i++)
            png_ptr->quantize_sort[i] = (png_byte)i;

         /* Find the least used palette entries by starting a
          * bubble sort, and running it until we have sorted
          * out enough colors.  Note that we don't care about
          * sorting all the colors, just finding which are
          * least used.
          */

         for (i = num_palette - 1; i >= maximum_colors; i--)
         {
            int done; /* To stop early if the list is pre-sorted */
            int j;

            done = 1;
            for (j = 0; j < i; j++)
            {
               if (histogram[png_ptr->quantize_sort[j]]
                   < histogram[png_ptr->quantize_sort[j + 1]])
               {
                  png_byte t;

                  t = png_ptr->quantize_sort[j];
                  png_ptr->quantize_sort[j] = png_ptr->quantize_sort[j + 1];
                  png_ptr->quantize_sort[j + 1] = t;
                  done = 0;
               }
            }

            if (done != 0)
               break;
         }

         /* Swap the palette around, and set up a table, if necessary */
         if (full_quantize != 0)
         {
            int j = num_palette;

            /* Put all the useful colors within the max, but don't
             * move the others.
             */
            for (i = 0; i < maximum_colors; i++)
            {
               if ((int)png_ptr->quantize_sort[i] >= maximum_colors)
               {
                  do
                     j--;
                  while ((int)png_ptr->quantize_sort[j] >= maximum_colors);

                  palette[i] = palette[j];
               }
            }
         }
         else
         {
            int j = num_palette;

            /* Move all the used colors inside the max limit, and
             * develop a translation table.
             */
            for (i = 0; i < maximum_colors; i++)
            {
               /* Only move the colors we need to */
               if ((int)png_ptr->quantize_sort[i] >= maximum_colors)
               {
                  png_color tmp_color;

                  do
                     j--;
                  while ((int)png_ptr->quantize_sort[j] >= maximum_colors);

                  tmp_color = palette[j];
                  palette[j] = palette[i];
                  palette[i] = tmp_color;
                  /* Indicate where the color went */
                  png_ptr->quantize_index[j] = (png_byte)i;
                  png_ptr->quantize_index[i] = (png_byte)j;
               }
            }

            /* Find closest color for those colors we are not using */
            for (i = 0; i < num_palette; i++)
            {
               if ((int)png_ptr->quantize_index[i] >= maximum_colors)
               {
                  int min_d, k, min_k, d_index;

                  /* Find the closest color to one we threw out */
                  d_index = png_ptr->quantize_index[i];
                  min_d = PNG_COLOR_DIST(palette[d_index], palette[0]);
                  for (k = 1, min_k = 0; k < maximum_colors; k++)
                  {
                     int d;

                     d = PNG_COLOR_DIST(palette[d_index], palette[k]);

                     if (d < min_d)
                     {
                        min_d = d;
                        min_k = k;
                     }
                  }
                  /* Point to closest color */
                  png_ptr->quantize_index[i] = (png_byte)min_k;
               }
            }
         }
         png_free(png_ptr, png_ptr->quantize_sort);
         png_ptr->quantize_sort = NULL;
      }
      else
      {
         /* This is much harder to do simply (and quickly).  Perhaps
          * we need to go through a median cut routine, but those
          * don't always behave themselves with only a few colors
          * as input.  So we will just find the closest two colors,
          * and throw out one of them (chosen somewhat randomly).
          * [We don't understand this at all, so if someone wants to
          *  work on improving it, be our guest - AED, GRP]
          */
         int i;
         int max_d;
         int num_new_palette;
         png_dsortp t;
         png_dsortpp hash;

         t = NULL;

         /* Initialize palette index arrays */
         png_ptr->index_to_palette = (png_bytep)png_malloc(png_ptr,
             (png_alloc_size_t)num_palette);
         png_ptr->palette_to_index = (png_bytep)png_malloc(png_ptr,
             (png_alloc_size_t)num_palette);

         /* Initialize the sort array */
         for (i = 0; i < num_palette; i++)
         {
            png_ptr->index_to_palette[i] = (png_byte)i;
            png_ptr->palette_to_index[i] = (png_byte)i;
         }

         hash = (png_dsortpp)png_calloc(png_ptr, (png_alloc_size_t)(769 *
             (sizeof (png_dsortp))));

         num_new_palette = num_palette;

         /* Initial wild guess at how far apart the farthest pixel
          * pair we will be eliminating will be.  Larger
          * numbers mean more areas will be allocated, Smaller
          * numbers run the risk of not saving enough data, and
          * having to do this all over again.
          *
          * I have not done extensive checking on this number.
          */
         max_d = 96;

         while (num_new_palette > maximum_colors)
         {
            for (i = 0; i < num_new_palette - 1; i++)
            {
               int j;

               for (j = i + 1; j < num_new_palette; j++)
               {
                  int d;

                  d = PNG_COLOR_DIST(palette[i], palette[j]);

                  if (d <= max_d)
                  {

                     t = (png_dsortp)png_malloc_warn(png_ptr,
                         (png_alloc_size_t)(sizeof (png_dsort)));

                     if (t == NULL)
                         break;

                     t->next = hash[d];
                     t->left = (png_byte)i;
                     t->right = (png_byte)j;
                     hash[d] = t;
                  }
               }
               if (t == NULL)
                  break;
            }

            if (t != NULL)
            for (i = 0; i <= max_d; i++)
            {
               if (hash[i] != NULL)
               {
                  png_dsortp p;

                  for (p = hash[i]; p; p = p->next)
                  {
                     if ((int)png_ptr->index_to_palette[p->left]
                         < num_new_palette &&
                         (int)png_ptr->index_to_palette[p->right]
                         < num_new_palette)
                     {
                        int j, next_j;

                        if (num_new_palette & 0x01)
                        {
                           j = p->left;
                           next_j = p->right;
                        }
                        else
                        {
                           j = p->right;
                           next_j = p->left;
                        }

                        num_new_palette--;
                        palette[png_ptr->index_to_palette[j]]
                            = palette[num_new_palette];
                        if (full_quantize == 0)
                        {
                           int k;

                           for (k = 0; k < num_palette; k++)
                           {
                              if (png_ptr->quantize_index[k] ==
                                  png_ptr->index_to_palette[j])
                                 png_ptr->quantize_index[k] =
                                     png_ptr->index_to_palette[next_j];

                              if ((int)png_ptr->quantize_index[k] ==
                                  num_new_palette)
                                 png_ptr->quantize_index[k] =
                                     png_ptr->index_to_palette[j];
                           }
                        }

                        png_ptr->index_to_palette[png_ptr->palette_to_index
                            [num_new_palette]] = png_ptr->index_to_palette[j];

                        png_ptr->palette_to_index[png_ptr->index_to_palette[j]]
                            = png_ptr->palette_to_index[num_new_palette];

                        png_ptr->index_to_palette[j] =
                            (png_byte)num_new_palette;

                        png_ptr->palette_to_index[num_new_palette] =
                            (png_byte)j;
                     }
                     if (num_new_palette <= maximum_colors)
                        break;
                  }
                  if (num_new_palette <= maximum_colors)
                     break;
               }
            }

            for (i = 0; i < 769; i++)
            {
               if (hash[i] != NULL)
               {
                  png_dsortp p = hash[i];
                  while (p)
                  {
                     t = p->next;
                     png_free(png_ptr, p);
                     p = t;
                  }
               }
               hash[i] = 0;
            }
            max_d += 96;
         }
         png_free(png_ptr, hash);
         png_free(png_ptr, png_ptr->palette_to_index);
         png_free(png_ptr, png_ptr->index_to_palette);
         png_ptr->palette_to_index = NULL;
         png_ptr->index_to_palette = NULL;
      }
      num_palette = maximum_colors;
   }
   if (png_ptr->palette == NULL)
   {
      png_ptr->palette = palette;
   }
   png_ptr->num_palette = (png_uint_16)num_palette;

   if (full_quantize != 0)
   {
      int i;
      png_bytep distance;
      int total_bits = PNG_QUANTIZE_RED_BITS + PNG_QUANTIZE_GREEN_BITS +
          PNG_QUANTIZE_BLUE_BITS;
      int num_red = (1 << PNG_QUANTIZE_RED_BITS);
      int num_green = (1 << PNG_QUANTIZE_GREEN_BITS);
      int num_blue = (1 << PNG_QUANTIZE_BLUE_BITS);
      size_t num_entries = ((size_t)1 << total_bits);

      png_ptr->palette_lookup = (png_bytep)png_calloc(png_ptr,
          (png_alloc_size_t)(num_entries));

      distance = (png_bytep)png_malloc(png_ptr, (png_alloc_size_t)num_entries);

      memset(distance, 0xff, num_entries);

      for (i = 0; i < num_palette; i++)
      {
         int ir, ig, ib;
         int r = (palette[i].red >> (8 - PNG_QUANTIZE_RED_BITS));
         int g = (palette[i].green >> (8 - PNG_QUANTIZE_GREEN_BITS));
         int b = (palette[i].blue >> (8 - PNG_QUANTIZE_BLUE_BITS));

         for (ir = 0; ir < num_red; ir++)
         {
            /* int dr = abs(ir - r); */
            int dr = ((ir > r) ? ir - r : r - ir);
            int index_r = (ir << (PNG_QUANTIZE_BLUE_BITS +
                PNG_QUANTIZE_GREEN_BITS));

            for (ig = 0; ig < num_green; ig++)
            {
               /* int dg = abs(ig - g); */
               int dg = ((ig > g) ? ig - g : g - ig);
               int dt = dr + dg;
               int dm = ((dr > dg) ? dr : dg);
               int index_g = index_r | (ig << PNG_QUANTIZE_BLUE_BITS);

               for (ib = 0; ib < num_blue; ib++)
               {
                  int d_index = index_g | ib;
                  /* int db = abs(ib - b); */
                  int db = ((ib > b) ? ib - b : b - ib);
                  int dmax = ((dm > db) ? dm : db);
                  int d = dmax + dt + db;

                  if (d < (int)distance[d_index])
                  {
                     distance[d_index] = (png_byte)d;
                     png_ptr->palette_lookup[d_index] = (png_byte)i;
                  }
               }
            }
         }
      }

      png_free(png_ptr, distance);
   }
}